

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::UniformCase::renderTest
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,ShaderProgram *program,Random *rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  deUint32 program_00;
  TestLog *this_00;
  RenderTarget *this_01;
  size_type sVar7;
  const_reference pvVar8;
  MessageBuilder *pMVar9;
  RenderContext *context;
  VarValue *value;
  VarValue *value_00;
  bool local_6c2;
  MessageBuilder local_698;
  undefined4 local_514;
  MessageBuilder local_510;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  LogImage local_340;
  RGBA local_2ac;
  RGBA local_2a8;
  int local_2a4;
  int local_2a0;
  int x;
  int y;
  int numFailedPixels;
  GLuint local_26c;
  undefined1 local_268 [4];
  int posLoc;
  string local_248;
  MessageBuilder local_228;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  int local_84;
  int local_80;
  int i_1;
  int j;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  Surface renderedImg;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  TestLog *log;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  this_01 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(this_01);
  iVar2 = de::min<int>(iVar2,0x20);
  iVar3 = tcu::RenderTarget::getHeight(this_01);
  iVar3 = de::min<int>(iVar3,0x20);
  iVar4 = tcu::RenderTarget::getWidth(this_01);
  renderedImg.m_pixels.m_cap._4_4_ = de::Random::getInt(rnd,0,iVar4 - iVar2);
  iVar4 = tcu::RenderTarget::getHeight(this_01);
  renderedImg.m_pixels.m_cap._0_4_ = de::Random::getInt(rnd,0,iVar4 - iVar3);
  tcu::Surface::Surface((Surface *)local_68,iVar2,iVar3);
  for (local_6c = 0; iVar4 = local_6c,
      sVar7 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              ::size(basicUniforms), iVar4 < (int)sVar7; local_6c = local_6c + 1) {
    pvVar8 = std::
             vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             ::operator[](basicUniforms,(long)local_6c);
    bVar1 = glu::isDataTypeSampler(pvVar8->type);
    if (bVar1) {
      for (local_80 = 0; local_80 < local_6c; local_80 = local_80 + 1) {
        pvVar8 = std::
                 vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                 ::operator[](basicUniforms,(long)local_80);
        bVar1 = glu::isDataTypeSampler(pvVar8->type);
        if (bVar1) {
          std::
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)local_6c);
          std::
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)local_80);
        }
      }
    }
  }
  for (local_84 = 0; iVar4 = local_84,
      sVar7 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              ::size(basicUniforms), iVar4 < (int)sVar7; local_84 = local_84 + 1) {
    pvVar8 = std::
             vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             ::operator[](basicUniforms,(long)local_84);
    bVar1 = glu::isDataTypeSampler(pvVar8->type);
    local_6c2 = false;
    if (bVar1) {
      local_98._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&this->m_filledTextureUnits);
      local_a0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&this->m_filledTextureUnits);
      pvVar8 = std::
               vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      local_90 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                           (local_98,local_a0,(pvVar8->finalValue).val.intV);
      local_a8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&this->m_filledTextureUnits);
      local_6c2 = __gnu_cxx::operator==(&local_90,&local_a8);
    }
    if (local_6c2 != false) {
      tcu::TestLog::operator<<(&local_228,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_228,(char (*) [28])"// Filling texture at unit ");
      pvVar8 = std::
               vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      apiVarValueStr_abi_cxx11_(&local_248,(Functional *)&pvVar8->finalValue,value);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_248);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])0xad69c7);
      pvVar8 = std::
               vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      shaderVarValueStr_abi_cxx11_((string *)local_268,(Functional *)&pvVar8->finalValue,value_00);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_268);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::string::~string((string *)&local_248);
      tcu::MessageBuilder::~MessageBuilder(&local_228);
      pvVar8 = std::
               vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      setupTexture(this,&pvVar8->finalValue);
    }
  }
  do {
    glu::CallLogWrapper::glViewport
              (&this->super_CallLogWrapper,renderedImg.m_pixels.m_cap._4_4_,
               (int)renderedImg.m_pixels.m_cap,iVar2,iVar3);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glViewport(viewportX, viewportY, viewportW, viewportH)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                    ,0x69f);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  program_00 = glu::ShaderProgram::getProgram(program);
  local_26c = glu::CallLogWrapper::glGetAttribLocation
                        (&this->super_CallLogWrapper,program_00,"a_position");
  glu::CallLogWrapper::glEnableVertexAttribArray(&this->super_CallLogWrapper,local_26c);
  glu::CallLogWrapper::glVertexAttribPointer
            (&this->super_CallLogWrapper,local_26c,4,0x1406,'\0',0,renderTest::position);
  do {
    glu::CallLogWrapper::glDrawElements(&this->super_CallLogWrapper,4,6,0x1403,renderTest::indices);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,
                    "glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                    ,0x6b0);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = renderedImg.m_pixels.m_cap._4_4_;
  iVar2 = (int)renderedImg.m_pixels.m_cap;
  tcu::Surface::getAccess((PixelBufferAccess *)&y,(Surface *)local_68);
  glu::readPixels(context,iVar3,iVar2,(PixelBufferAccess *)&y);
  x = 0;
  for (local_2a0 = 0; iVar2 = local_2a0, iVar3 = tcu::Surface::getHeight((Surface *)local_68),
      iVar2 < iVar3; local_2a0 = local_2a0 + 1) {
    for (local_2a4 = 0; iVar2 = local_2a4, iVar3 = tcu::Surface::getWidth((Surface *)local_68),
        iVar2 < iVar3; local_2a4 = local_2a4 + 1) {
      local_2a8 = tcu::Surface::getPixel((Surface *)local_68,local_2a4,local_2a0);
      local_2ac = tcu::RGBA::white();
      bVar1 = tcu::RGBA::operator!=(&local_2a8,&local_2ac);
      if (bVar1) {
        x = x + 1;
      }
    }
  }
  bVar1 = x < 1;
  if (bVar1) {
    tcu::TestLog::operator<<(&local_698,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_698,
                        (char (*) [65])
                        "Success: got all-white pixels (all uniforms have correct values)");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_698);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"RenderedImage",&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"Rendered image",&local_389);
    tcu::LogImage::LogImage
              (&local_340,&local_360,&local_388,(Surface *)local_68,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_00,&local_340);
    tcu::LogImage::~LogImage(&local_340);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    tcu::TestLog::operator<<(&local_510,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_510,(char (*) [39])"FAILURE: image comparison failed, got ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&x);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [18])" non-white pixels");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_510);
  }
  local_514 = 1;
  tcu::Surface::~Surface((Surface *)local_68);
  return bVar1;
}

Assistant:

bool UniformCase::renderTest (const vector<BasicUniform>& basicUniforms, const ShaderProgram& program, Random& rnd)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	const int					viewportW		= de::min(renderTarget.getWidth(),	MAX_RENDER_WIDTH);
	const int					viewportH		= de::min(renderTarget.getHeight(),	MAX_RENDER_HEIGHT);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);
	tcu::Surface				renderedImg		(viewportW, viewportH);

	// Assert that no two samplers of different types have the same texture unit - this is an error in GL.
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type))
		{
			for (int j = 0; j < i; j++)
			{
				if (glu::isDataTypeSampler(basicUniforms[j].type) && basicUniforms[i].type != basicUniforms[j].type)
					DE_ASSERT(basicUniforms[i].finalValue.val.samplerV.unit != basicUniforms[j].finalValue.val.samplerV.unit);
			}
		}
	}

	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type) && std::find(m_filledTextureUnits.begin(), m_filledTextureUnits.end(), basicUniforms[i].finalValue.val.samplerV.unit) == m_filledTextureUnits.end())
		{
			log << TestLog::Message << "// Filling texture at unit " << apiVarValueStr(basicUniforms[i].finalValue) << " with color " << shaderVarValueStr(basicUniforms[i].finalValue) << TestLog::EndMessage;
			setupTexture(basicUniforms[i].finalValue);
		}
	}

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportW, viewportH));

	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		const int posLoc = glGetAttribLocation(program.getProgram(), "a_position");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);

		GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]));
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	int numFailedPixels = 0;
	for (int y = 0; y < renderedImg.getHeight(); y++)
	{
		for (int x = 0; x < renderedImg.getWidth(); x++)
		{
			if (renderedImg.getPixel(x, y) != tcu::RGBA::white())
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("RenderedImage", "Rendered image", renderedImg);
		log << TestLog::Message << "FAILURE: image comparison failed, got " << numFailedPixels << " non-white pixels" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "Success: got all-white pixels (all uniforms have correct values)" << TestLog::EndMessage;
		return true;
	}
}